

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O3

void __thiscall rudp::session::disconnect(session *this)

{
  service_registry *psVar1;
  int in_R8D;
  impl_type *piStack_50;
  service_registry *local_48;
  undefined1 local_38 [32];
  undefined1 local_18 [16];
  
  generate_rst((session *)local_38);
  std::__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rudp::session,void>
            ((__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2> *)&piStack_50,
             (__weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_18._0_8_ = 0;
  local_18[8] = '\0';
  local_18[9] = '\0';
  local_18[10] = '\0';
  local_18[0xb] = '\0';
  local_18[0xc] = '\0';
  local_18[0xd] = '\0';
  local_18[0xe] = '\0';
  local_18[0xf] = '\0';
  local_38._16_8_ = (io_service *)0x0;
  local_38._24_8_ = (socket *)0x0;
  local_38._16_8_ = operator_new(0x18);
  psVar1 = local_48;
  (((io_service *)local_38._16_8_)->super_execution_context).service_registry_ =
       (service_registry *)this;
  ((io_service *)local_38._16_8_)->impl_ = piStack_50;
  local_48 = (service_registry *)0x0;
  (((io_service *)(local_38._16_8_ + 0x10))->super_execution_context).service_registry_ = psVar1;
  piStack_50 = (impl_type *)0x0;
  local_18._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:192:34)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:192:34)>
       ::_M_manager;
  send(this,(int)local_38,(void *)0x0,(size_t)(local_38 + 0x10),in_R8D);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_38 + 0x10,local_38 + 0x10,3);
  }
  if (local_48 != (service_registry *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
  }
  return;
}

Assistant:

void session::disconnect() {
    send( generate_rst(), false, [this,this_=shared_from_this()]( bool ) {
      close();
    } );
  }